

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_cpp.cpp
# Opt level: O1

mfb_stub * mfb_stub::GetInstance(mfb_window *window)

{
  mfb_stub *pmVar1;
  mfb_window *pmVar2;
  pointer __position;
  undefined8 in_RAX;
  mfb_stub *pmVar3;
  mfb_stub *extraout_RAX;
  pointer ppmVar4;
  bool bVar5;
  mfb_stub *local_20;
  
  pmVar3 = (mfb_stub *)CONCAT71((int7)((ulong)in_RAX >> 8),GetInstance(mfb_window*)::s_instances);
  if (GetInstance(mfb_window*)::s_instances == '\0') {
    GetInstance();
    pmVar3 = extraout_RAX;
  }
  __position = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  bVar5 = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar5) {
    pmVar1 = *GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pmVar2 = pmVar1->m_window;
    pmVar3 = pmVar1;
    ppmVar4 = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while (pmVar2 != window) {
      ppmVar4 = ppmVar4 + 1;
      bVar5 = ppmVar4 ==
              GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      pmVar3 = pmVar1;
      if (bVar5) break;
      pmVar3 = *ppmVar4;
      pmVar2 = pmVar3->m_window;
    }
  }
  if (bVar5) {
    pmVar3 = (mfb_stub *)operator_new(0xe8);
    memset(pmVar3,0,0xe8);
    if (__position ==
        GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      local_20 = pmVar3;
      std::vector<mfb_stub*,std::allocator<mfb_stub*>>::_M_realloc_insert<mfb_stub*>
                ((vector<mfb_stub*,std::allocator<mfb_stub*>> *)&GetInstance::s_instances,
                 (iterator)__position,&local_20);
    }
    else {
      *__position = pmVar3;
      GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>._M_impl.
    super__Vector_impl_data._M_finish[-1]->m_window = window;
    pmVar3 = GetInstance::s_instances.super__Vector_base<mfb_stub_*,_std::allocator<mfb_stub_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
  }
  return pmVar3;
}

Assistant:

mfb_stub *
mfb_stub::GetInstance(struct mfb_window *window) {
    static std::vector<mfb_stub *>  s_instances;

    for(mfb_stub *instance : s_instances) {
        if(instance->m_window == window) {
            return instance;
        }
    }

    s_instances.push_back(new mfb_stub);
    s_instances.back()->m_window = window;

    return s_instances.back();
}